

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int run_test_suite(TestSuite *suite,TestReporter *reporter)

{
  int iVar1;
  long in_RSI;
  bool bVar2;
  int success;
  TestReporter *in_stack_00000018;
  TestSuite *in_stack_00000020;
  
  iVar1 = per_test_timeout_defined();
  if (iVar1 != 0) {
    validate_per_test_timeout_value();
  }
  setup_reporting((TestReporter *)0x10f7c7);
  run_every_test(in_stack_00000020,in_stack_00000018);
  bVar2 = false;
  if (*(int *)(in_RSI + 0x68) == 0) {
    bVar2 = *(int *)(in_RSI + 0x6c) == 0;
  }
  return (uint)!bVar2;
}

Assistant:

int run_test_suite(TestSuite *suite, TestReporter *reporter)
{
    int success;
    if (per_test_timeout_defined())
    {
        validate_per_test_timeout_value();
    }

    setup_reporting(reporter);
    run_every_test(suite, reporter);
    success = (reporter->total_failures == 0) && (reporter->total_exceptions == 0);
    return success ? EXIT_SUCCESS : EXIT_FAILURE;
}